

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O0

void wasm::TypeUpdating::updateParamTypes
               (Function *func,vector<wasm::Type,_std::allocator<wasm::Type>_> *newParamTypes,
               Module *wasm,LocalUpdatingMode localUpdating)

{
  uint uVar1;
  bool bVar2;
  Index IVar3;
  size_type sVar4;
  Type TVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  size_t sVar8;
  pointer ppVar9;
  const_reference pvVar10;
  LocalGet *pLVar11;
  Block *pBVar12;
  reference ppLVar13;
  reference ppLVar14;
  ReFinalize local_320;
  Index local_1dc;
  LocalSet *pLStack_1d8;
  Index index_3;
  LocalSet *set_2;
  iterator __end3_3;
  iterator __begin3_3;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *__range3_3;
  Index index_2;
  LocalGet *get_1;
  iterator __end3_2;
  iterator __begin3_2;
  vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *__range3_2;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_188;
  iterator iter_2;
  LocalSet *set_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *__range3_1;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_158;
  iterator iter_1;
  LocalGet *get;
  iterator __end3;
  iterator __begin3;
  vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *__range3;
  LocalSet *local_128;
  Index local_11c;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_118;
  uint fixup;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_110;
  iterator iter;
  undefined1 local_100 [4];
  Index index_1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> contents;
  Builder builder;
  FindAll<wasm::LocalGet> gets;
  Index local_ac;
  LocalSet *pLStack_a8;
  Index index;
  LocalSet *set;
  iterator __end2;
  iterator __begin2;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *__range2;
  undefined1 local_78 [8];
  FindAll<wasm::LocalSet> sets;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  paramFixups;
  LocalUpdatingMode localUpdating_local;
  Module *wasm_local;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *newParamTypes_local;
  Function *func_local;
  
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&sets.list.
                      super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)local_78,func->body);
  __end2 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::begin
                     ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_78);
  set = (LocalSet *)
        std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::end
                  ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_78);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                                     *)&set), bVar2) {
    ppLVar14 = __gnu_cxx::
               __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
               ::operator*(&__end2);
    pLStack_a8 = *ppLVar14;
    local_ac = pLStack_a8->index;
    bVar2 = Function::isParam(func,local_ac);
    if ((bVar2) &&
       (sVar4 = std::
                unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::count((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)&sets.list.
                            super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_ac), sVar4 == 0
       )) {
      TVar5.id = (pLStack_a8->value->type).id;
      pvVar10 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                          (newParamTypes,(ulong)local_ac);
      bVar2 = wasm::Type::isSubType(TVar5,(Type)pvVar10->id);
      if (!bVar2) {
        TVar5 = Function::getLocalType(func,local_ac);
        IVar3 = Builder::addVar(func,TVar5);
        pmVar6 = std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                               *)&sets.list.
                                  super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_ac);
        *pmVar6 = IVar3;
      }
    }
    __gnu_cxx::
    __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
    ::operator++(&__end2);
  }
  FindAll<wasm::LocalGet>::FindAll((FindAll<wasm::LocalGet> *)&builder,func->body);
  bVar2 = std::
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::empty((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&sets.list.
                      super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar2) {
    Builder::Builder((Builder *)
                     &contents.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,wasm);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_100);
    for (iter.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
         _4_4_ = 0;
        uVar7 = (ulong)iter.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ._M_cur._4_4_, sVar8 = Function::getNumParams(func), uVar7 < sVar8;
        iter.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
        _4_4_ = iter.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                _M_cur._4_4_ + 1) {
      local_110._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&sets.list.
                      super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (key_type *)
                  ((long)&iter.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                          ._M_cur + 4));
      _Stack_118._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)&sets.list.
                     super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage);
      bVar2 = std::__detail::operator!=(&local_110,&stack0xfffffffffffffee8);
      if (bVar2) {
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_110);
        uVar1 = iter.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                _M_cur._4_4_;
        IVar3 = ppVar9->second;
        local_11c = IVar3;
        if (localUpdating == Update) {
          pvVar10 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                              (newParamTypes,
                               (ulong)iter.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                      ._M_cur._4_4_);
          __range3 = (vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)pvVar10->id;
        }
        else {
          __range3 = (vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
                     Function::getLocalType
                               (func,iter.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                     ._M_cur._4_4_);
        }
        pLVar11 = Builder::makeLocalGet
                            ((Builder *)
                             &contents.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar1,
                             (Type)__range3);
        local_128 = Builder::makeLocalSet
                              ((Builder *)
                               &contents.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,IVar3,
                               (Expression *)pLVar11);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_100,
                   (value_type *)&local_128);
      }
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_100,
               &func->body);
    pBVar12 = Builder::
              makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                        ((Builder *)
                         &contents.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         local_100);
    func->body = (Expression *)pBVar12;
    __end3 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::begin
                       ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)&builder);
    get = (LocalGet *)
          std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::end
                    ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)&builder);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                                       *)&get), bVar2) {
      ppLVar13 = __gnu_cxx::
                 __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                 ::operator*(&__end3);
      iter_1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
           (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)*ppLVar13;
      local_158._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&sets.list.
                      super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (key_type *)
                  ((long)iter_1.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                         ._M_cur + 0x10));
      __range3_1 = (vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                   std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)&sets.list.
                             super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = std::__detail::operator!=
                        (&local_158,
                         (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> *)
                         &__range3_1);
      if (bVar2) {
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_158);
        *(uint *)((long)iter_1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        ._M_cur + 0x10) = ppVar9->second;
      }
      __gnu_cxx::
      __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
      ::operator++(&__end3);
    }
    __end3_1 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::begin
                         ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_78);
    set_1 = (LocalSet *)
            std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::end
                      ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_78);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                               *)&set_1), bVar2) {
      ppLVar14 = __gnu_cxx::
                 __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                 ::operator*(&__end3_1);
      iter_2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
           (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)*ppLVar14;
      local_188._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&sets.list.
                      super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (key_type *)
                  ((long)iter_2.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                         ._M_cur + 0x10));
      __range3_2 = (vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
                   std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)&sets.list.
                             super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = std::__detail::operator!=
                        (&local_188,
                         (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> *)
                         &__range3_2);
      if (bVar2) {
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_188);
        *(uint *)((long)iter_2.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        ._M_cur + 0x10) = ppVar9->second;
      }
      __gnu_cxx::
      __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
      ::operator++(&__end3_1);
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_100);
  }
  if (localUpdating == Update) {
    __end3_2 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::begin
                         ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)&builder);
    get_1 = (LocalGet *)
            std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::end
                      ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)&builder);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_2,
                              (__normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                               *)&get_1), bVar2) {
      ppLVar13 = __gnu_cxx::
                 __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                 ::operator*(&__end3_2);
      pLVar11 = *ppLVar13;
      uVar1 = pLVar11->index;
      bVar2 = Function::isParam(func,uVar1);
      if (bVar2) {
        pvVar10 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                            (newParamTypes,(ulong)uVar1);
        (pLVar11->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             pvVar10->id;
      }
      __gnu_cxx::
      __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
      ::operator++(&__end3_2);
    }
    __end3_3 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::begin
                         ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_78);
    set_2 = (LocalSet *)
            std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::end
                      ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_78);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_3,
                              (__normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                               *)&set_2), bVar2) {
      ppLVar14 = __gnu_cxx::
                 __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                 ::operator*(&__end3_3);
      pLStack_1d8 = *ppLVar14;
      local_1dc = pLStack_1d8->index;
      bVar2 = Function::isParam(func,local_1dc);
      if ((bVar2) && (bVar2 = LocalSet::isTee(pLStack_1d8), bVar2)) {
        pvVar10 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                            (newParamTypes,(ulong)local_1dc);
        (pLStack_1d8->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id =
             pvVar10->id;
        LocalSet::finalize(pLStack_1d8);
      }
      __gnu_cxx::
      __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
      ::operator++(&__end3_3);
    }
  }
  ReFinalize::ReFinalize(&local_320);
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
            (&local_320.
              super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
              .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
              super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,func,
             wasm);
  ReFinalize::~ReFinalize(&local_320);
  bVar2 = std::
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::empty((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&sets.list.
                      super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar2) {
    handleNonDefaultableLocals(func,wasm);
  }
  FindAll<wasm::LocalGet>::~FindAll((FindAll<wasm::LocalGet> *)&builder);
  FindAll<wasm::LocalSet>::~FindAll((FindAll<wasm::LocalSet> *)local_78);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)&sets.list.
                       super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void updateParamTypes(Function* func,
                      const std::vector<Type>& newParamTypes,
                      Module& wasm,
                      LocalUpdatingMode localUpdating) {
  // Before making this update, we must be careful if the param was "reused",
  // specifically, if it is assigned a less-specific type in the body then
  // we'd get a validation error when we refine it. To handle that, if a less-
  // specific type is assigned simply switch to a new local, that is, we can
  // do a fixup like this:
  //
  // function foo(x : oldType) {
  //   ..
  //   x = (oldType)val;
  //
  // =>
  //
  // function foo(x : newType) {
  //   var x_oldType = x; // assign the param immediately to a fixup var
  //   ..
  //   x_oldType = (oldType)val; // fixup var is used throughout the body
  //
  // Later optimization passes may be able to remove the extra var, and can
  // take advantage of the refined argument type while doing so.

  // A map of params that need a fixup to the new fixup var used for it.
  std::unordered_map<Index, Index> paramFixups;

  FindAll<LocalSet> sets(func->body);

  for (auto* set : sets.list) {
    auto index = set->index;
    if (func->isParam(index) && !paramFixups.count(index) &&
        !Type::isSubType(set->value->type, newParamTypes[index])) {
      paramFixups[index] = Builder::addVar(func, func->getLocalType(index));
    }
  }

  FindAll<LocalGet> gets(func->body);

  // Apply the fixups we identified that we need.
  if (!paramFixups.empty()) {
    // Write the params immediately to the fixups.
    Builder builder(wasm);
    std::vector<Expression*> contents;
    for (Index index = 0; index < func->getNumParams(); index++) {
      auto iter = paramFixups.find(index);
      if (iter != paramFixups.end()) {
        auto fixup = iter->second;
        contents.push_back(builder.makeLocalSet(
          fixup,
          builder.makeLocalGet(index,
                               localUpdating == Update
                                 ? newParamTypes[index]
                                 : func->getLocalType(index))));
      }
    }
    contents.push_back(func->body);
    func->body = builder.makeBlock(contents);

    // Update gets and sets using the param to use the fixup.
    for (auto* get : gets.list) {
      auto iter = paramFixups.find(get->index);
      if (iter != paramFixups.end()) {
        get->index = iter->second;
      }
    }
    for (auto* set : sets.list) {
      auto iter = paramFixups.find(set->index);
      if (iter != paramFixups.end()) {
        set->index = iter->second;
      }
    }
  }

  // Update local.get/local.tee operations that use the modified param type.
  if (localUpdating == Update) {
    for (auto* get : gets.list) {
      auto index = get->index;
      if (func->isParam(index)) {
        get->type = newParamTypes[index];
      }
    }
    for (auto* set : sets.list) {
      auto index = set->index;
      if (func->isParam(index) && set->isTee()) {
        set->type = newParamTypes[index];
        set->finalize();
      }
    }
  }

  // Propagate the new get and set types outwards.
  ReFinalize().walkFunctionInModule(func, &wasm);

  if (!paramFixups.empty()) {
    // We have added locals, and must handle non-nullability of them.
    TypeUpdating::handleNonDefaultableLocals(func, wasm);
  }
}